

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wlcStdin.c
# Opt level: O1

Vec_Str_t * Wlc_ConvertToRadix(uint *pBits,int Start,int nBits,int Radix)

{
  int iVar1;
  uint uVar2;
  uint uVar3;
  Vec_Str_t *pVVar4;
  char *pcVar5;
  char *pcVar6;
  ulong uVar7;
  uint uVar8;
  uint uVar9;
  size_t __size;
  int iVar10;
  char cVar11;
  
  pVVar4 = (Vec_Str_t *)malloc(0x10);
  iVar1 = 0x10;
  if (0xe < nBits - 1U) {
    iVar1 = nBits;
  }
  pVVar4->nSize = 0;
  pVVar4->nCap = iVar1;
  if (iVar1 == 0) {
    pcVar5 = (char *)0x0;
  }
  else {
    pcVar5 = (char *)malloc((long)iVar1);
  }
  pVVar4->pArray = pcVar5;
  pVVar4->nSize = nBits;
  pcVar6 = (char *)0x0;
  memset(pcVar5,0,(long)nBits);
  if (iVar1 != 0) {
    pcVar6 = (char *)malloc((long)iVar1);
  }
  memset(pcVar6,0,(long)nBits);
  if (0x21 < Radix - 2U) {
    __assert_fail("Radix >= 2 && Radix < 36",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/wlc/wlcStdin.c"
                  ,0x44,"Vec_Str_t *Wlc_ConvertToRadix(unsigned int *, int, int, int)");
  }
  *pcVar6 = '\x01';
  if (0 < nBits) {
    iVar10 = 0;
    do {
      if ((pBits[Start + iVar10 >> 5] >> (Start + iVar10 & 0x1fU) & 1) != 0) {
        Wlc_ComputeSum(pcVar5,pcVar6,nBits,Radix);
      }
      if (iVar10 < (int)(nBits - 1U)) {
        Wlc_ComputeSum(pcVar6,pcVar6,nBits,Radix);
      }
      iVar10 = iVar10 + 1;
    } while (nBits != iVar10);
  }
  free(pcVar6);
  uVar7 = (ulong)(uint)nBits;
  uVar8 = nBits >> 0x1f & nBits;
  uVar2 = nBits;
  do {
    uVar7 = uVar7 - 1;
    uVar9 = uVar8;
    uVar3 = uVar8 - 1;
    if ((int)uVar2 < 1) break;
    uVar3 = uVar2 - 1;
    uVar9 = uVar2;
    uVar2 = uVar3;
  } while (pcVar5[uVar7 & 0xffffffff] == '\0');
  if (nBits < (int)uVar9) {
    __assert_fail("p->nSize >= nSizeNew",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecStr.h"
                  ,0x20a,"void Vec_StrShrink(Vec_Str_t *, int)");
  }
  pVVar4->nSize = uVar9;
  if (0 < (int)uVar9) {
    iVar10 = uVar3 + 1;
    pcVar6 = pcVar5 + uVar3;
    do {
      cVar11 = '0';
      if ('\t' < *pcVar6) {
        cVar11 = 'W';
      }
      *pcVar6 = cVar11 + *pcVar6;
      iVar10 = iVar10 + -1;
      pcVar6 = pcVar6 + -1;
    } while (0 < iVar10);
  }
  if (1 < (int)uVar9) {
    uVar7 = 0;
    uVar2 = uVar9;
    do {
      uVar2 = uVar2 - 1;
      cVar11 = pcVar5[uVar7];
      pcVar5[uVar7] = pcVar5[(int)uVar2];
      pcVar5[(int)uVar2] = cVar11;
      uVar7 = uVar7 + 1;
    } while (uVar9 >> 1 != uVar7);
  }
  if (uVar9 == 0) {
    if (iVar1 == 0) {
      if (pcVar5 == (char *)0x0) {
        pcVar5 = (char *)malloc(0x10);
      }
      else {
        pcVar5 = (char *)realloc(pcVar5,0x10);
      }
      pVVar4->pArray = pcVar5;
      pVVar4->nCap = 0x10;
    }
    pVVar4->nSize = 1;
    *pVVar4->pArray = '0';
  }
  uVar2 = pVVar4->nSize;
  uVar8 = pVVar4->nCap;
  if (uVar2 == uVar8) {
    if ((int)uVar8 < 0x10) {
      if (pVVar4->pArray == (char *)0x0) {
        pcVar5 = (char *)malloc(0x10);
      }
      else {
        pcVar5 = (char *)realloc(pVVar4->pArray,0x10);
      }
      __size = 0x10;
    }
    else {
      __size = (ulong)uVar8 * 2;
      if ((int)__size <= (int)uVar8) goto LAB_001ca4ff;
      if (pVVar4->pArray == (char *)0x0) {
        pcVar5 = (char *)malloc(__size);
      }
      else {
        pcVar5 = (char *)realloc(pVVar4->pArray,__size);
      }
    }
    pVVar4->pArray = pcVar5;
    pVVar4->nCap = (int)__size;
  }
LAB_001ca4ff:
  pVVar4->nSize = uVar2 + 1;
  pVVar4->pArray[(int)uVar2] = '\0';
  return pVVar4;
}

Assistant:

Vec_Str_t * Wlc_ConvertToRadix( unsigned * pBits, int Start, int nBits, int Radix )
{
    Vec_Str_t * vRes = Vec_StrStart( nBits );
    Vec_Str_t * vSum = Vec_StrStart( nBits );
    char * pRes = Vec_StrArray( vRes );
    char * pSum = Vec_StrArray( vSum );  int i;
    assert( Radix >= 2 && Radix < 36 );
    pSum[0] = 1;
    // compute number
    for ( i = 0; i < nBits; i++ )
    {
        if ( Abc_InfoHasBit(pBits, Start + i) )
            Wlc_ComputeSum( pRes, pSum, nBits, Radix );
        if ( i < nBits - 1 )
            Wlc_ComputeSum( pSum, pSum, nBits, Radix );
    }
    Vec_StrFree( vSum );
    // remove zeros
    for ( i = nBits - 1; i >= 0; i-- )
        if ( pRes[i] )
            break;
    Vec_StrShrink( vRes, i+1 );
    // convert to chars
    for ( ; i >= 0; i-- )
    {
        if ( pRes[i] < 10 )
            pRes[i] += '0';
        else
            pRes[i] += 'a' - 10;
    }
    Vec_StrReverseOrder( vRes );
    if ( Vec_StrSize(vRes) == 0 )
        Vec_StrPush( vRes, '0' );
    Vec_StrPush( vRes, '\0' );
    return vRes;
}